

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

LINK_HANDLE
link_create_from_endpoint
          (SESSION_HANDLE session,LINK_ENDPOINT_HANDLE link_endpoint,char *name,role role,
          AMQP_VALUE source,AMQP_VALUE target)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  TICK_COUNTER_HANDLE pTVar3;
  SINGLYLINKEDLIST_HANDLE pSVar4;
  size_t sVar5;
  void *pvVar6;
  LOGGER_LOG l_3;
  size_t name_length;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  LINK_INSTANCE *result;
  AMQP_VALUE target_local;
  AMQP_VALUE source_local;
  role role_local;
  char *name_local;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  SESSION_HANDLE session_local;
  
  l = (LOGGER_LOG)calloc(1,200);
  if (l == (LOGGER_LOG)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_create_from_endpoint",0x33b,1,"Cannot create link");
    }
  }
  else {
    *(undefined4 *)(l + 8) = 1;
    *(undefined4 *)(l + 0xc) = 1;
    *(SESSION_HANDLE *)l = session;
    *(undefined4 *)(l + 0x20) = 0;
    l[0x68] = (code)0x0;
    l[0x69] = (code)0x0;
    *(undefined4 *)(l + 0x40) = 0;
    *(undefined4 *)(l + 0x6c) = 0;
    *(undefined8 *)(l + 0x70) = 0;
    *(undefined4 *)(l + 0x84) = 10000;
    *(undefined8 *)(l + 0x78) = 0;
    l[0x98] = (code)0x0;
    l[0x99] = (code)0x0;
    *(undefined8 *)(l + 0x90) = 0;
    *(undefined8 *)(l + 0xa0) = 0;
    *(undefined4 *)(l + 0xa8) = 0;
    *(undefined4 *)(l + 0xac) = 0;
    pAVar2 = amqpvalue_clone(target);
    *(AMQP_VALUE *)(l + 0x10) = pAVar2;
    pAVar2 = amqpvalue_clone(source);
    *(AMQP_VALUE *)(l + 0x18) = pAVar2;
    *(undefined8 *)(l + 0xb8) = 0;
    *(undefined8 *)(l + 0xc0) = 0;
    if (role) {
      l[0x44] = (code)0x0;
    }
    else {
      l[0x44] = (code)0x1;
    }
    pTVar3 = tickcounter_create();
    *(TICK_COUNTER_HANDLE *)(l + 0xb0) = pTVar3;
    if (*(long *)(l + 0xb0) == 0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_create_from_endpoint",0x361,1,"Cannot create tick counter for link");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      pSVar4 = singlylinkedlist_create();
      *(SINGLYLINKEDLIST_HANDLE *)(l + 0x38) = pSVar4;
      if (*(long *)(l + 0x38) == 0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                    ,"link_create_from_endpoint",0x36a,1,"Cannot create pending deliveries list");
        }
        tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0xb0));
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        sVar5 = strlen(name);
        pvVar6 = malloc(sVar5 + 1);
        *(void **)(l + 0x30) = pvVar6;
        if (*(long *)(l + 0x30) == 0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                      ,"link_create_from_endpoint",0x375,1,"Cannot allocate memory for link name");
          }
          tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0xb0));
          singlylinkedlist_destroy(*(SINGLYLINKEDLIST_HANDLE *)(l + 0x38));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          memcpy(*(void **)(l + 0x30),name,sVar5 + 1);
          *(undefined8 *)(l + 0x48) = 0;
          *(undefined8 *)(l + 0x60) = 0;
          *(LINK_ENDPOINT_HANDLE *)(l + 0x28) = link_endpoint;
        }
      }
    }
  }
  return (LINK_HANDLE)l;
}

Assistant:

LINK_HANDLE link_create_from_endpoint(SESSION_HANDLE session, LINK_ENDPOINT_HANDLE link_endpoint, const char* name, role role, AMQP_VALUE source, AMQP_VALUE target)
{
    LINK_INSTANCE* result = (LINK_INSTANCE*)calloc(1, sizeof(LINK_INSTANCE));
    if (result == NULL)
    {
        LogError("Cannot create link");
    }
    else
    {
        result->link_state = LINK_STATE_DETACHED;
        result->previous_link_state = LINK_STATE_DETACHED;
        result->session = session;
        result->handle = 0;
        result->snd_settle_mode = sender_settle_mode_unsettled;
        result->rcv_settle_mode = receiver_settle_mode_first;
        result->delivery_count = 0;
        result->initial_delivery_count = 0;
        result->max_message_size = 0;
        result->max_link_credit = DEFAULT_LINK_CREDIT;
        result->peer_max_message_size = 0;
        result->is_underlying_session_begun = false;
        result->is_closed = false;
        result->attach_properties = NULL;
        result->received_payload = NULL;
        result->received_payload_size = 0;
        result->received_delivery_id = 0;
        result->source = amqpvalue_clone(target);
        result->target = amqpvalue_clone(source);
        result->on_link_detach_received_event_subscription.on_link_detach_received = NULL;
        result->on_link_detach_received_event_subscription.context = NULL;

        if (role == role_sender)
        {
            result->role = role_receiver;
        }
        else
        {
            result->role = role_sender;
        }

        result->tick_counter = tickcounter_create();
        if (result->tick_counter == NULL)
        {
            LogError("Cannot create tick counter for link");
            free(result);
            result = NULL;
        }
        else
        {
            result->pending_deliveries = singlylinkedlist_create();
            if (result->pending_deliveries == NULL)
            {
                LogError("Cannot create pending deliveries list");
                tickcounter_destroy(result->tick_counter);
                free(result);
                result = NULL;
            }
            else
            {
                size_t name_length = strlen(name);
                result->name = (char*)malloc(name_length + 1);
                if (result->name == NULL)
                {
                    LogError("Cannot allocate memory for link name");
                    tickcounter_destroy(result->tick_counter);
                    singlylinkedlist_destroy(result->pending_deliveries);
                    free(result);
                    result = NULL;
                }
                else
                {
                    (void)memcpy(result->name, name, name_length + 1);
                    result->on_link_state_changed = NULL;
                    result->callback_context = NULL;
                    result->link_endpoint = link_endpoint;
                }
            }
        }
    }

    return result;
}